

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::GPUShaderFP64Test10::testBegin
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint program_id,GLuint vertex
          )

{
  GLuint GVar1;
  int iVar2;
  uint uVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLuint GVar6;
  _variable_type _Var7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  GLchar *pGVar11;
  uniformDVecFunctionPointer p_Var12;
  uniformDMatFunctionPointer p_Var13;
  uniformIVecFunctionPointer p_Var14;
  uniformUVecFunctionPointer p_Var15;
  TestError *this_00;
  uint argument;
  GLdouble *pGVar16;
  GPUShaderFP64Test10 *this_01;
  ulong __new_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> transform_feedback_buffer_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  long lVar10;
  
  GVar1 = functionObject::getArgumentStride(function_object);
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar2);
  uVar3 = (*function_object->_vptr_functionObject[3])(function_object);
  GVar4 = functionObject::getResultStride(function_object);
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __new_size = (ulong)GVar4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_48,__new_size);
  (**(code **)(lVar10 + 0x40))(0x8c8e,this->m_transform_feedback_buffer_id);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3b38);
  (**(code **)(lVar10 + 0x150))
            (0x8c8e,__new_size,
             local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88ea);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"BufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3b3c);
  (**(code **)(lVar10 + 0x50))(0x8c8e,0,this->m_transform_feedback_buffer_id,0,__new_size);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3b40);
  (**(code **)(lVar10 + 0xd8))(this->m_vertex_array_object_id);
  dVar5 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar5,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x3b44);
  if (uVar3 != 0) {
    argument = 0;
    do {
      iVar2 = 0;
      if (argument != 0) {
        GVar4 = 0;
        iVar2 = 0;
        do {
          GVar6 = functionObject::getArgumentStride(function_object,GVar4);
          iVar2 = iVar2 + GVar6;
          GVar4 = GVar4 + 1;
        } while (argument != GVar4);
      }
      _Var7 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)argument);
      this_01 = (GPUShaderFP64Test10 *)(ulong)_Var7;
      uVar8 = Utils::getNumberOfColumnsForVariableType(_Var7);
      pGVar11 = getUniformName(this_01,argument);
      iVar9 = (**(code **)(lVar10 + 0xb48))(program_id,pGVar11);
      pGVar16 = (GLdouble *)
                ((this->m_argument_data).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (iVar2 + GVar1 * vertex));
      dVar5 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar5,"GetUniformLocation",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x3b4f);
      if (iVar9 == -1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Inactive uniform",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x3b53);
LAB_0094dab3:
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (uVar8 == 1) {
        _Var7 = Utils::getBaseVariableType(_Var7);
        if (_Var7 == VARIABLE_TYPE_UINT) {
          p_Var15 = getUniformFunctionForUVec(this,argument,function_object);
          (*p_Var15)(iVar9,1,(GLuint *)pGVar16);
        }
        else if (_Var7 == VARIABLE_TYPE_INT) {
          p_Var14 = getUniformFunctionForIVec(this,argument,function_object);
          (*p_Var14)(iVar9,1,(GLint *)pGVar16);
        }
        else {
          if (_Var7 != VARIABLE_TYPE_DOUBLE) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Not implemented",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                       ,0x3b70);
            goto LAB_0094dab3;
          }
          p_Var12 = getUniformFunctionForDVec(this,argument,function_object);
          (*p_Var12)(iVar9,1,pGVar16);
        }
      }
      else {
        p_Var13 = getUniformFunctionForDMat(this,argument,function_object);
        (*p_Var13)(iVar9,1,'\0',pGVar16);
      }
      argument = argument + 1;
    } while (argument != uVar3);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::testBegin(const functionObject& function_object, glw::GLuint program_id, glw::GLuint vertex)
{
	const glw::GLuint	 arguments_stride   = function_object.getArgumentStride();
	const glw::Functions& gl				 = m_context.getRenderContext().getFunctions();
	const glw::GLuint	 n_arguments		 = function_object.getArgumentCount();
	const glw::GLuint	 result_buffer_size = function_object.getResultStride();
	const glw::GLuint	 vertex_offset		 = arguments_stride * vertex;

	/* Update transform feedback buffer */
	std::vector<glw::GLubyte> transform_feedback_buffer_data;
	transform_feedback_buffer_data.resize(result_buffer_size);

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, result_buffer_size, &transform_feedback_buffer_data[0],
				  GL_DYNAMIC_COPY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BufferData");

	gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_transform_feedback_buffer_id, 0 /* offset */,
					   result_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

	/* Update VAO */
	gl.bindVertexArray(m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArray");

	for (glw::GLuint argument = 0; argument < n_arguments; ++argument)
	{
		const glw::GLuint			argument_offset  = function_object.getArgumentOffset(argument);
		const Utils::_variable_type argument_type	= function_object.getArgumentType(argument);
		const glw::GLuint			n_columns		 = Utils::getNumberOfColumnsForVariableType(argument_type);
		const glw::GLchar*			uniform_name	 = getUniformName(argument);
		const glw::GLint			uniform_location = gl.getUniformLocation(program_id, uniform_name);
		const glw::GLdouble*		uniform_src = (glw::GLdouble*)&m_argument_data[vertex_offset + argument_offset];

		GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

		if (-1 == uniform_location)
		{
			TCU_FAIL("Inactive uniform");
		}

		if (1 == n_columns)
		{
			switch (Utils::getBaseVariableType(argument_type))
			{
			case Utils::VARIABLE_TYPE_DOUBLE:
			{
				uniformDVecFunctionPointer p_uniform_function = getUniformFunctionForDVec(argument, function_object);

				p_uniform_function(uniform_location, 1 /* count */, uniform_src);
			}
			break;
			case Utils::VARIABLE_TYPE_UINT:
			{
				uniformUVecFunctionPointer p_uniform_function = getUniformFunctionForUVec(argument, function_object);

				p_uniform_function(uniform_location, 1 /* count */, (glw::GLuint*)uniform_src);
			}
			break;
			case Utils::VARIABLE_TYPE_INT:
			{
				uniformIVecFunctionPointer p_uniform_function = getUniformFunctionForIVec(argument, function_object);

				p_uniform_function(uniform_location, 1 /* count */, (glw::GLint*)uniform_src);
			}
			break;
			default:
				TCU_FAIL("Not implemented");
				break;
			}
		}
		else
		{
			uniformDMatFunctionPointer p_uniform_function = getUniformFunctionForDMat(argument, function_object);

			p_uniform_function(uniform_location, 1 /* count */, GL_FALSE /* transpose */, uniform_src);
		}
	}
}